

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateData.cpp
# Opt level: O3

void __thiscall
amrex::StateData::InterpAddBox
          (StateData *this,MultiFabCopyDescriptor *multiFabCopyDesc,
          Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_> *mfid,
          BoxList *unfillableBoxes,
          Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_> *returnedFillBoxIds,
          Box *subbox,Real time,int src_comp,int dest_comp,int num_comp,bool extrap)

{
  double dVar1;
  double dVar2;
  pointer pFVar3;
  pointer pFVar4;
  double dVar5;
  TimeCenter TVar6;
  FabArrayId fabarrayid;
  FillBoxId local_54;
  
  TVar6 = StateDescriptor::timeType(this->desc);
  if (TVar6 == Point) {
    if ((this->old_data)._M_t.
        super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
        super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
        super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl != (MultiFab *)0x0) {
      pFVar3 = (mfid->super_vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>).
               super__Vector_base<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>._M_impl.
               super__Vector_impl_data._M_start;
      amrex::InterpAddBox(multiFabCopyDesc,unfillableBoxes,returnedFillBoxIds,subbox,
                          (MultiFabId)pFVar3[1].fabArrayId,(MultiFabId)pFVar3->fabArrayId,
                          (this->old_time).start,(this->new_time).start,time,src_comp,dest_comp,
                          num_comp,extrap);
      return;
    }
  }
  else {
    dVar1 = (this->new_time).start;
    dVar2 = (this->old_time).start;
    dVar5 = (dVar1 - dVar2) * 0.001;
    if ((time <= dVar1 - dVar5) || ((this->new_time).stop + dVar5 <= time)) {
      if (((time <= dVar2 - dVar5) ||
          ((this->old_data)._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
           super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
           super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl == (MultiFab *)0x0)) ||
         (dVar5 + (this->old_time).stop <= time)) {
        Error_host("StateData::Interp(): cannot interp");
        return;
      }
      std::vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>::resize
                (&returnedFillBoxIds->
                  super_vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,1);
      fabarrayid.fabArrayId =
           (mfid->super_vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>).
           super__Vector_base<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>._M_impl.
           super__Vector_impl_data._M_start[1].fabArrayId;
      goto LAB_005c375c;
    }
  }
  std::vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>::resize
            (&returnedFillBoxIds->super_vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,
             1);
  fabarrayid.fabArrayId =
       ((mfid->super_vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>).
        super__Vector_base<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>._M_impl.
        super__Vector_impl_data._M_start)->fabArrayId;
LAB_005c375c:
  FabArrayCopyDescriptor<amrex::FArrayBox>::AddBox
            (&local_54,&multiFabCopyDesc->super_FabArrayCopyDescriptor<amrex::FArrayBox>,fabarrayid,
             subbox,unfillableBoxes,src_comp,dest_comp,num_comp);
  pFVar4 = (returnedFillBoxIds->super_vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>).
           super__Vector_base<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>._M_impl.
           super__Vector_impl_data._M_start;
  pFVar4->m_fabIndex = local_54.m_fabIndex;
  *(undefined8 *)((long)&(pFVar4->m_fillBox).bigend + 4) = local_54.m_fillBox.bigend.vect._4_8_;
  *(undefined8 *)&(pFVar4->m_fillBox).btype = local_54._24_8_;
  *(undefined8 *)&(pFVar4->m_fillBox).smallend = local_54.m_fillBox.smallend.vect._0_8_;
  *(undefined8 *)((long)&(pFVar4->m_fillBox).smallend + 8) = local_54.m_fillBox._8_8_;
  return;
}

Assistant:

void
StateData::InterpAddBox (MultiFabCopyDescriptor& multiFabCopyDesc,
                         Vector<MultiFabId>&      mfid,
                         BoxList*                unfillableBoxes,
                         Vector<FillBoxId>&       returnedFillBoxIds,
                         const Box&              subbox,
                         Real                    time,
                         int                     src_comp,
                         int                     dest_comp,
                         int                     num_comp,
                         bool                    extrap)
{
    if (desc->timeType() == StateDescriptor::Point)
    {
        if (old_data == nullptr)
        {
            returnedFillBoxIds.resize(1);
            returnedFillBoxIds[0] = multiFabCopyDesc.AddBox(mfid[MFNEWDATA],
                                                            subbox,
                                                            unfillableBoxes,
                                                            src_comp,
                                                            dest_comp,
                                                            num_comp);
        }
        else
        {
            amrex::InterpAddBox(multiFabCopyDesc,
                                unfillableBoxes,
                                returnedFillBoxIds,
                                subbox,
                                mfid[MFOLDDATA],
                                mfid[MFNEWDATA],
                                old_time.start,
                                new_time.start,
                                time,
                                src_comp,
                                dest_comp,
                                num_comp,
                                extrap);
        }
    }
    else
    {
        const Real teps = (new_time.start - old_time.start)*1.e-3_rt;

        if (time > new_time.start-teps && time < new_time.stop+teps)
        {
            returnedFillBoxIds.resize(1);
            returnedFillBoxIds[0] = multiFabCopyDesc.AddBox(mfid[MFNEWDATA],
                                                            subbox,
                                                            unfillableBoxes,
                                                            src_comp,
                                                            dest_comp,
                                                            num_comp);
        }
        else if (old_data != nullptr        &&
                 time > old_time.start-teps &&
                 time < old_time.stop+teps)
        {
            returnedFillBoxIds.resize(1);
            returnedFillBoxIds[0] = multiFabCopyDesc.AddBox(mfid[MFOLDDATA],
                                                            subbox,
                                                            unfillableBoxes,
                                                            src_comp,
                                                            dest_comp,
                                                            num_comp);
        }
        else
        {
            amrex::Error("StateData::Interp(): cannot interp");
        }
   }
}